

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectories::AddRuntimeLibrary(cmOrderDirectories *this,string *fullPath,char *soname)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  cmOrderDirectoriesConstraintSOName *pcVar4;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string dir;
  string local_70;
  string local_50;
  
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->EmmittedConstraintSOName,fullPath);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((this->ImplicitDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      cmsys::SystemTools::GetFilenamePath(&dir,fullPath);
      lVar3 = std::__cxx11::string::rfind((char *)fullPath,0x419380);
      if (lVar3 != -1) {
        if ((AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::splitFramework == '\0') &&
           (iVar2 = __cxa_guard_acquire(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)
                                         ::splitFramework), iVar2 != 0)) {
          cmsys::RegularExpression::RegularExpression
                    (&AddRuntimeLibrary::splitFramework,"^(.*)/(.*).framework/(.*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &AddRuntimeLibrary::splitFramework,&__dso_handle);
          __cxa_guard_release(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::
                               splitFramework);
        }
        bVar1 = cmsys::RegularExpression::find(&AddRuntimeLibrary::splitFramework,fullPath);
        if (bVar1) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_70,&AddRuntimeLibrary::splitFramework.regmatch,3);
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_50,&AddRuntimeLibrary::splitFramework.regmatch,2);
          lVar3 = std::__cxx11::string::find((string *)&local_70,(ulong)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          if (lVar3 != -1) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_
                      (&local_70,&AddRuntimeLibrary::splitFramework.regmatch,1);
            std::__cxx11::string::operator=((string *)&dir,(string *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
      }
      bVar1 = IsImplicitDirectory(this,&dir);
      if (bVar1) {
        pcVar4 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
        cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
                  (pcVar4,this,fullPath,soname);
        local_70._M_dataplus._M_p = (pointer)pcVar4;
        std::vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>::
        emplace_back<cmOrderDirectoriesConstraint*>
                  ((vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>
                    *)&this->ImplicitDirEntries,(cmOrderDirectoriesConstraint **)&local_70);
        std::__cxx11::string::~string((string *)&dir);
        return;
      }
      std::__cxx11::string::~string((string *)&dir);
    }
    pcVar4 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
    cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
              (pcVar4,this,fullPath,soname);
    dir._M_dataplus._M_p = (pointer)pcVar4;
    std::vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>::
    emplace_back<cmOrderDirectoriesConstraint*>
              ((vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>
                *)&this->ConstraintEntries,(cmOrderDirectoriesConstraint **)&dir);
  }
  return;
}

Assistant:

void cmOrderDirectories::AddRuntimeLibrary(std::string const& fullPath,
                                           const char* soname)
{
  // Add the runtime library at most once.
  if (this->EmmittedConstraintSOName.insert(fullPath).second) {
    // Implicit link directories need special handling.
    if (!this->ImplicitDirectories.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);

      if (fullPath.rfind(".framework") != std::string::npos) {
        static cmsys::RegularExpression splitFramework(
          "^(.*)/(.*).framework/(.*)$");
        if (splitFramework.find(fullPath) &&
            (std::string::npos !=
             splitFramework.match(3).find(splitFramework.match(2)))) {
          dir = splitFramework.match(1);
        }
      }

      if (this->IsImplicitDirectory(dir)) {
        this->ImplicitDirEntries.push_back(
          new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
        return;
      }
    }

    // Construct the runtime information entry for this library.
    this->ConstraintEntries.push_back(
      new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
  } else {
    // This can happen if the same library is linked multiple times.
    // In that case the runtime information check need be done only
    // once anyway.  For shared libs we could add a check in AddItem
    // to not repeat them.
  }
}